

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase_test.cpp
# Opt level: O3

void __thiscall
jhu::thrax::PhraseTests_RemoveIndices_Test::~PhraseTests_RemoveIndices_Test
          (PhraseTests_RemoveIndices_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PhraseTests, RemoveIndices) {
  Span s{0, 3};
  auto is = s.indices();
  removeIndices(is, {0, 1});
  ASSERT_EQ(2, is.size());
  EXPECT_EQ(1, is.front());
  EXPECT_EQ(2, is.back());
}